

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

int __thiscall
TPZSparseBlockDiagonal<long_double>::Put
          (TPZSparseBlockDiagonal<long_double> *this,int64_t row,int64_t col,longdouble *value)

{
  longdouble lVar1;
  int *piVar2;
  long lVar3;
  long *plVar4;
  longdouble *plVar5;
  longdouble *in_RCX;
  int64_t *in_RDI;
  int64_t pos;
  int64_t cblockindex;
  int64_t cblock;
  int64_t rblockindex;
  int64_t rblock;
  int64_t *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  TPZSparseBlockDiagonal<long_double> *in_stack_ffffffffffffffc0;
  long local_38;
  TPZSparseBlockDiagonal<long_double> *local_30;
  int local_4;
  
  FindBlockIndex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 in_RDI);
  if (local_30 == (TPZSparseBlockDiagonal<long_double> *)0xffffffffffffffff) {
    local_4 = -1;
  }
  else {
    FindBlockIndex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   in_RDI);
    if (in_stack_ffffffffffffffc0 == local_30) {
      piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xc),(int64_t)local_30);
      lVar3 = local_38 + in_stack_ffffffffffffffb8 * *piVar2;
      lVar1 = *in_RCX;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 8),(int64_t)local_30);
      plVar5 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 4),*plVar4 + lVar3);
      *plVar5 = lVar1;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::Put(const int64_t row, const int64_t col, const TVar& value)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return -1;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return -1;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	this->fStorage[this->fBlockPos[rblock]+pos] = value;
	return 0;
}